

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inverse_mglsa_digital_filter.cc
# Opt level: O1

bool __thiscall
sptk::InverseMglsaDigitalFilter::Run
          (InverseMglsaDigitalFilter *this,
          vector<double,_std::allocator<double>_> *filter_coefficients,double filter_input,
          double *filter_output,Buffer *buffer)

{
  vector<double,_std::allocator<double>_> *this_00;
  uint uVar1;
  int iVar2;
  pointer pdVar3;
  pointer pdVar4;
  double *pdVar5;
  bool bVar6;
  long lVar7;
  double *pdVar8;
  ulong uVar9;
  pointer pdVar10;
  long lVar11;
  size_type sVar12;
  pointer pdVar13;
  long lVar14;
  long lVar15;
  ulong uVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  
  if (this->is_valid_ == true) {
    bVar6 = false;
    if (((buffer != (Buffer *)0x0) && (bVar6 = false, filter_output != (double *)0x0)) &&
       (sVar12 = (long)this->num_filter_order_ + 1, bVar6 = false,
       (long)(filter_coefficients->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_finish -
       (long)(filter_coefficients->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start >> 3 == sVar12)) {
      if (this->num_stage_ == 0) {
        this_00 = &buffer->inverse_filter_coefficients_;
        if ((long)(buffer->inverse_filter_coefficients_).
                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(buffer->inverse_filter_coefficients_).
                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start >> 3 != sVar12) {
          std::vector<double,_std::allocator<double>_>::resize
                    ((vector<double,_std::allocator<double>_> *)this_00,sVar12);
        }
        pdVar8 = (filter_coefficients->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar5 = (filter_coefficients->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
        if (pdVar8 != pdVar5) {
          pdVar10 = (this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data._M_start;
          do {
            *pdVar10 = -*pdVar8;
            pdVar8 = pdVar8 + 1;
            pdVar10 = pdVar10 + 1;
          } while (pdVar8 != pdVar5);
        }
        bVar6 = MlsaDigitalFilter::Run
                          (&this->mlsa_digital_filter_,
                           (vector<double,_std::allocator<double>_> *)this_00,filter_input,
                           filter_output,&buffer->mlsa_digital_filter_buffer_);
        return bVar6;
      }
      sVar12 = (size_type)(this->num_stage_ * (int)sVar12);
      if ((long)(buffer->signals_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(buffer->signals_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start >> 3 != sVar12) {
        std::vector<double,_std::allocator<double>_>::resize
                  ((vector<double,_std::allocator<double>_> *)&buffer->signals_,sVar12);
        pdVar10 = (buffer->signals_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pdVar3 = (buffer->signals_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        if (pdVar10 != pdVar3) {
          memset(pdVar10,0,((long)pdVar3 + (-8 - (long)pdVar10) & 0xfffffffffffffff8U) + 8);
        }
      }
      dVar17 = exp(-*(filter_coefficients->super__Vector_base<double,_std::allocator<double>_>).
                     _M_impl.super__Vector_impl_data._M_start);
      dVar17 = dVar17 * filter_input;
      uVar1 = this->num_filter_order_;
      lVar7 = (long)(int)uVar1;
      if ((lVar7 != 0) && (iVar2 = this->num_stage_, 0 < (long)iVar2)) {
        uVar9 = (ulong)uVar1;
        pdVar3 = (filter_coefficients->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        dVar18 = 1.0 - this->alpha_ * this->alpha_;
        pdVar4 = (buffer->signals_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        bVar6 = this->transposition_;
        lVar14 = (long)(int)(uVar1 + 1);
        pdVar10 = pdVar4 + 1;
        lVar11 = 0;
        pdVar13 = pdVar4;
        do {
          lVar15 = lVar14 * 8 * lVar11;
          pdVar8 = pdVar4 + lVar11 * lVar14;
          dVar19 = *pdVar8;
          if (bVar6 == false) {
            dVar19 = dVar19 * pdVar3[1];
            if (1 < (int)uVar1) {
              dVar20 = *(pointer)((long)pdVar4 + lVar15);
              lVar15 = 0;
              do {
                dVar20 = (pdVar10[lVar15 + 1] - dVar20) * this->alpha_ + pdVar10[lVar15];
                pdVar10[lVar15] = dVar20;
                dVar19 = dVar19 + pdVar3[lVar15 + 2] * dVar20;
                lVar15 = lVar15 + 1;
              } while (uVar9 - 1 != lVar15);
            }
            lVar15 = uVar9 + 1;
            if (0 < (int)uVar1) {
              do {
                pdVar13[lVar15 + -1] = pdVar13[lVar15 + -2];
                lVar15 = lVar15 + -1;
              } while (1 < lVar15);
            }
            *pdVar8 = this->alpha_ * *pdVar8 + dVar17 * dVar18;
            dVar17 = dVar19 + dVar17;
          }
          else {
            pdVar8[lVar7] = pdVar3[lVar7] * dVar17 + this->alpha_ * pdVar8[lVar7 + -1];
            if (1 < (int)uVar1) {
              dVar20 = *(double *)((long)pdVar4 + lVar15 + uVar9 * 8);
              lVar15 = uVar9 + 1;
              do {
                dVar20 = pdVar3[lVar15 + -2] * dVar17 +
                         (pdVar13[lVar15 + -3] - dVar20) * this->alpha_ + pdVar13[lVar15 + -2];
                pdVar13[lVar15 + -2] = dVar20;
                lVar15 = lVar15 + -1;
              } while (2 < lVar15);
            }
            dVar17 = dVar19 * dVar18 + dVar17;
            if (0 < (int)uVar1) {
              uVar16 = 0;
              do {
                pdVar10[uVar16 - 1] = pdVar10[uVar16];
                uVar16 = uVar16 + 1;
              } while (uVar9 != uVar16);
            }
          }
          lVar11 = lVar11 + 1;
          pdVar10 = pdVar10 + lVar14;
          pdVar13 = pdVar13 + lVar14;
        } while (lVar11 != iVar2);
      }
      *filter_output = dVar17;
      bVar6 = true;
    }
  }
  else {
    bVar6 = false;
  }
  return bVar6;
}

Assistant:

bool InverseMglsaDigitalFilter::Run(
    const std::vector<double>& filter_coefficients, double filter_input,
    double* filter_output, InverseMglsaDigitalFilter::Buffer* buffer) const {
  // Check inputs.
  if (!is_valid_ ||
      filter_coefficients.size() !=
          static_cast<std::size_t>(num_filter_order_ + 1) ||
      NULL == filter_output || NULL == buffer) {
    return false;
  }

  // Use inverse MLSA filter.
  if (0 == num_stage_) {
    if (buffer->inverse_filter_coefficients_.size() !=
        static_cast<std::size_t>(num_filter_order_ + 1)) {
      buffer->inverse_filter_coefficients_.resize(num_filter_order_ + 1);
    }
    std::transform(filter_coefficients.begin(), filter_coefficients.end(),
                   buffer->inverse_filter_coefficients_.begin(),
                   std::negate<double>());
    return mlsa_digital_filter_.Run(buffer->inverse_filter_coefficients_,
                                    filter_input, filter_output,
                                    &buffer->mlsa_digital_filter_buffer_);
  }

  // Prepare memories.
  if (buffer->signals_.size() !=
      static_cast<std::size_t>((num_filter_order_ + 1) * num_stage_)) {
    buffer->signals_.resize((num_filter_order_ + 1) * num_stage_);
    std::fill(buffer->signals_.begin(), buffer->signals_.end(), 0.0);
  }

  const double gained_input(filter_input * std::exp(-filter_coefficients[0]));
  if (0 == num_filter_order_) {
    *filter_output = gained_input;
    return true;
  }

  const double* b(&(filter_coefficients[1]));
  const double beta(1.0 - alpha_ * alpha_);
  double x(gained_input);

  for (int i(0); i < num_stage_; ++i) {
    double* d(&buffer->signals_[(num_filter_order_ + 1) * i]);
    if (transposition_) {
      const double y(x + beta * d[0]);
      d[num_filter_order_] =
          b[num_filter_order_ - 1] * x + alpha_ * d[num_filter_order_ - 1];
      for (int j(num_filter_order_ - 1); 0 < j; --j) {
        d[j] += b[j - 1] * x + alpha_ * (d[j - 1] - d[j + 1]);
      }

      for (int j(0); j < num_filter_order_; ++j) {
        d[j] = d[j + 1];
      }

      x = y;
    } else {
      double y(d[0] * b[0]);
      for (int j(1); j < num_filter_order_; ++j) {
        d[j] += alpha_ * (d[j + 1] - d[j - 1]);
        y += d[j] * b[j];
      }
      y += x;

      for (int j(num_filter_order_); 0 < j; --j) {
        d[j] = d[j - 1];
      }
      d[0] = alpha_ * d[0] + beta * x;

      x = y;
    }
  }

  *filter_output = x;

  return true;
}